

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O0

void __thiscall SQCompilation::Block::addStatement(Block *this,Statement *stmt)

{
  ArenaVector<SQCompilation::Statement_*> *in_RSI;
  Statement **in_stack_ffffffffffffffe8;
  
  ArenaVector<SQCompilation::Statement_*>::push_back(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void addStatement(Statement *stmt) { assert(stmt); _statements.push_back(stmt); }